

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# within.hpp
# Opt level: O2

type_conflict
perior::within<perior::point<double,2ul>,perior::cubic_periodic_boundary>
          (rectangle<perior::point<double,_2UL>_> *inner,
          rectangle<perior::point<double,_2UL>_> *outer,
          cubic_periodic_boundary<perior::point<double,_2UL>_> *b)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  const_reference pdVar4;
  reference pdVar5;
  double *pdVar6;
  ulong i_00;
  size_t i;
  size_type sVar7;
  point<double,_2UL> retval;
  point<double,_2UL> dc;
  array<double,_2UL> local_58;
  array<double,_2UL> local_48;
  
  local_58.elems[0] = 0.0;
  local_58.elems[1] = 0.0;
  for (sVar7 = 0; sVar7 != 2; sVar7 = sVar7 + 1) {
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)outer,sVar7);
    dVar1 = *pdVar4;
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)inner,sVar7);
    dVar2 = *pdVar4;
    pdVar5 = boost::array<double,_2UL>::operator[](&local_58,sVar7);
    *pdVar5 = dVar1 - dVar2;
  }
  for (sVar7 = 0; sVar7 != 2; sVar7 = sVar7 + 1) {
    pdVar5 = boost::array<double,_2UL>::operator[](&local_58,sVar7);
    dVar1 = *pdVar5;
    pdVar4 = boost::array<double,_2UL>::operator[](&(b->half_width_).values_,sVar7);
    if (-*pdVar4 <= dVar1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&local_58,sVar7);
      dVar1 = *pdVar5;
      pdVar4 = boost::array<double,_2UL>::operator[](&(b->half_width_).values_,sVar7);
      if (*pdVar4 <= dVar1) {
        pdVar4 = boost::array<double,_2UL>::operator[](&(b->width_).values_,sVar7);
        dVar1 = *pdVar4;
        pdVar6 = boost::array<double,_2UL>::operator[](&local_58,sVar7);
        dVar1 = *pdVar6 - dVar1;
        goto LAB_0010e854;
      }
    }
    else {
      pdVar4 = boost::array<double,_2UL>::operator[](&(b->width_).values_,sVar7);
      dVar1 = *pdVar4;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_58,sVar7);
      dVar1 = dVar1 + *pdVar6;
LAB_0010e854:
      *pdVar6 = dVar1;
    }
  }
  local_48.elems[0] = local_58.elems[0];
  local_48.elems[1] = local_58.elems[1];
  uVar3 = 0;
  do {
    i_00 = uVar3;
    if (i_00 == 2) break;
    pdVar4 = boost::array<double,_2UL>::operator[](&local_48,i_00);
    dVar1 = *pdVar4;
    pdVar4 = boost::array<double,_2UL>::operator[](&(outer->radius).values_,i_00);
    dVar2 = *pdVar4;
    pdVar4 = boost::array<double,_2UL>::operator[](&(inner->radius).values_,i_00);
    uVar3 = i_00 + 1;
  } while (ABS(dVar1) <= dVar2 - *pdVar4);
  return 1 < i_00;
}

Assistant:

inline typename boost::enable_if<traits::is_point<pointT>, bool>::type
within(const rectangle<pointT>& inner, const rectangle<pointT>& outer,
       const boundaryT<pointT>& b)
    BOOST_NOEXCEPT_OR_NOTHROW
{
    const pointT dc(restrict_direction(outer.center - inner.center, b));
    for(std::size_t i=0; i<traits::dimension<pointT>::value; ++i)
    {
        if(std::abs(dc[i]) > outer.radius[i] - inner.radius[i])
        {
            return false;
        }
    }
    return true;
}